

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void sat_solver_set_resource_limits
               (sat_solver *s,ABC_INT64_T nConfLimit,ABC_INT64_T nInsLimit,
               ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  ABC_INT64_T nInsLimitGlobal_local;
  ABC_INT64_T nConfLimitGlobal_local;
  ABC_INT64_T nInsLimit_local;
  ABC_INT64_T nConfLimit_local;
  sat_solver *s_local;
  
  s->nRestarts = 0;
  s->nConfLimit = 0;
  s->nInsLimit = 0;
  if (nConfLimit != 0) {
    s->nConfLimit = (s->stats).conflicts + nConfLimit;
  }
  if (nInsLimit != 0) {
    s->nInsLimit = (s->stats).propagations + nInsLimit;
  }
  if ((nConfLimitGlobal != 0) && ((s->nConfLimit == 0 || (nConfLimitGlobal < s->nConfLimit)))) {
    s->nConfLimit = nConfLimitGlobal;
  }
  if ((nInsLimitGlobal != 0) && ((s->nInsLimit == 0 || (nInsLimitGlobal < s->nInsLimit)))) {
    s->nInsLimit = nInsLimitGlobal;
  }
  return;
}

Assistant:

void sat_solver_set_resource_limits(sat_solver* s, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    // set the external limits
    s->nRestarts  = 0;
    s->nConfLimit = 0;
    s->nInsLimit  = 0;
    if ( nConfLimit )
        s->nConfLimit = s->stats.conflicts + nConfLimit;
    if ( nInsLimit )
//        s->nInsLimit = s->stats.inspects + nInsLimit;
        s->nInsLimit = s->stats.propagations + nInsLimit;
    if ( nConfLimitGlobal && (s->nConfLimit == 0 || s->nConfLimit > nConfLimitGlobal) )
        s->nConfLimit = nConfLimitGlobal;
    if ( nInsLimitGlobal && (s->nInsLimit == 0 || s->nInsLimit > nInsLimitGlobal) )
        s->nInsLimit = nInsLimitGlobal;
}